

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_object_armor(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  random_conflict rVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"ac");
    *(wchar_t *)((long)pvVar3 + 0x6c) = wVar1;
    rVar4 = parser_getrand(p,"to-a");
    *(random_conflict *)((long)pvVar3 + 0x5c) = rVar4;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_object_armor(struct parser *p) {
	struct object_kind *k = parser_priv(p);

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	k->ac = parser_getint(p, "ac");
	k->to_a = parser_getrand(p, "to-a");
	return PARSE_ERROR_NONE;
}